

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<8,_8,_1,_false,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::InstanceIntersectorK<8>_>,_false>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  undefined1 (*pauVar1) [32];
  undefined4 uVar2;
  ulong uVar3;
  anon_union_32_3_898e2e57_for_vboolf_impl<8>_1 aVar4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  NodeRef nodeRef;
  long lVar14;
  ulong uVar15;
  undefined1 (*pauVar16) [32];
  ulong *puVar17;
  ulong uVar18;
  Primitive *prim;
  bool bVar19;
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [64];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  Precalculations pre;
  vint8 bi;
  vbool<8> valid0;
  NodeRef stack_node [561];
  vfloat<8> stack_near [561];
  Precalculations local_59c1;
  ulong local_59c0;
  RayK<8> *local_59b8;
  RayK<8> *local_59b0;
  ulong local_59a8;
  undefined1 local_59a0 [32];
  anon_union_32_3_898e2e57_for_vboolf_impl<8>_1 local_5980;
  undefined1 local_5960 [32];
  undefined1 local_5940 [32];
  undefined1 local_5920 [32];
  undefined1 local_5900 [32];
  undefined1 local_58e0 [32];
  undefined1 local_58c0 [32];
  float local_58a0;
  float fStack_589c;
  float fStack_5898;
  float fStack_5894;
  float fStack_5890;
  float fStack_588c;
  float fStack_5888;
  undefined4 uStack_5884;
  float local_5880;
  float fStack_587c;
  float fStack_5878;
  float fStack_5874;
  float fStack_5870;
  float fStack_586c;
  float fStack_5868;
  uint uStack_5864;
  float local_5860;
  float fStack_585c;
  float fStack_5858;
  float fStack_5854;
  float fStack_5850;
  float fStack_584c;
  float fStack_5848;
  uint uStack_5844;
  anon_union_32_3_898e2e57_for_vboolf_impl<8>_1 local_5840;
  undefined8 local_5810;
  ulong local_5808 [561];
  undefined1 local_4680 [32];
  undefined1 local_4660 [32];
  undefined1 local_4640 [17936];
  undefined1 auVar26 [64];
  
  uVar18 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (uVar18 != 8) {
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar20 = vpcmpeqd_avx2(in_ZMM2._0_32_,in_ZMM2._0_32_);
      auVar24 = vpcmpeqd_avx2(auVar20,(undefined1  [32])valid_i->field_0);
      auVar20 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(ZEXT816(0) << 0x40),5);
      auVar21 = auVar24 & auVar20;
      if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar21 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar21 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar21 >> 0x7f,0) != '\0') ||
            (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar21 >> 0xbf,0) != '\0') ||
          (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar21[0x1f] < '\0') {
        local_59b8 = ray + 0x100;
        auVar20 = vandps_avx(auVar20,auVar24);
        auVar6 = vpackssdw_avx(auVar20._0_16_,auVar20._16_16_);
        auVar20 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),ZEXT1632(ZEXT816(0) << 0x40));
        local_5960 = vpmovsxwd_avx2(auVar6);
        local_4680._8_4_ = 0x7f800000;
        local_4680._0_8_ = 0x7f8000007f800000;
        local_4680._12_4_ = 0x7f800000;
        local_4680._16_4_ = 0x7f800000;
        local_4680._20_4_ = 0x7f800000;
        local_4680._24_4_ = 0x7f800000;
        local_4680._28_4_ = 0x7f800000;
        auVar37 = ZEXT3264(local_4680);
        local_58e0 = vblendvps_avx(local_4680,auVar20,local_5960);
        auVar38 = ZEXT3264(local_58e0);
        auVar7 = vpcmpeqd_avx(auVar20._0_16_,auVar20._0_16_);
        uStack_5864 = *(uint *)(ray + 0x1c) ^ 0x80000000;
        auVar20 = *(undefined1 (*) [32])(ray + 0x20);
        auVar21 = vpmovsxwd_avx2(auVar6 ^ auVar7);
        auVar36 = ZEXT3264(auVar21);
        local_5810 = 0xfffffffffffffff8;
        local_5808[0] = uVar18;
        local_4660 = local_58e0;
        if (uVar18 != 0xfffffffffffffff8) {
          auVar32._8_4_ = 0x7fffffff;
          auVar32._0_8_ = 0x7fffffff7fffffff;
          auVar32._12_4_ = 0x7fffffff;
          auVar32._16_4_ = 0x7fffffff;
          auVar32._20_4_ = 0x7fffffff;
          auVar32._24_4_ = 0x7fffffff;
          auVar32._28_4_ = 0x7fffffff;
          auVar34._8_4_ = 0x219392ef;
          auVar34._0_8_ = 0x219392ef219392ef;
          auVar34._12_4_ = 0x219392ef;
          auVar34._16_4_ = 0x219392ef;
          auVar34._20_4_ = 0x219392ef;
          auVar34._24_4_ = 0x219392ef;
          auVar34._28_4_ = 0x219392ef;
          auVar21 = vandps_avx(*(undefined1 (*) [32])(ray + 0x80),auVar32);
          auVar21 = vcmpps_avx(auVar21,auVar34,1);
          auVar24 = vblendvps_avx(*(undefined1 (*) [32])(ray + 0x80),auVar34,auVar21);
          auVar21 = vandps_avx(*(undefined1 (*) [32])(ray + 0xa0),auVar32);
          auVar21 = vcmpps_avx(auVar21,auVar34,1);
          auVar5 = vblendvps_avx(*(undefined1 (*) [32])(ray + 0xa0),auVar34,auVar21);
          auVar21 = vandps_avx(*(undefined1 (*) [32])(ray + 0xc0),auVar32);
          auVar21 = vcmpps_avx(auVar21,auVar34,1);
          auVar21 = vblendvps_avx(*(undefined1 (*) [32])(ray + 0xc0),auVar34,auVar21);
          auVar32 = vrcpps_avx(auVar24);
          auVar29._8_4_ = 0x3f800000;
          auVar29._0_8_ = 0x3f8000003f800000;
          auVar29._12_4_ = 0x3f800000;
          auVar29._16_4_ = 0x3f800000;
          auVar29._20_4_ = 0x3f800000;
          auVar29._24_4_ = 0x3f800000;
          auVar29._28_4_ = 0x3f800000;
          auVar7 = vfnmadd213ps_fma(auVar24,auVar32,auVar29);
          auVar24 = vrcpps_avx(auVar5);
          auVar6 = vfnmadd213ps_fma(auVar5,auVar24,auVar29);
          auVar5 = vrcpps_avx(auVar21);
          auVar11 = vfnmadd213ps_fma(auVar21,auVar5,auVar29);
          auVar6 = vfmadd132ps_fma(ZEXT1632(auVar6),auVar24,auVar24);
          auVar39 = ZEXT1664(auVar6);
          auVar7 = vfmadd132ps_fma(ZEXT1632(auVar7),auVar32,auVar32);
          auVar35 = ZEXT1664(auVar7);
          auVar11 = vfmadd132ps_fma(ZEXT1632(auVar11),auVar5,auVar5);
          auVar40 = ZEXT1664(auVar11);
          puVar17 = local_5808;
          local_5860 = auVar7._0_4_ * -*(float *)ray;
          fStack_585c = auVar7._4_4_ * -*(float *)(ray + 4);
          fStack_5858 = auVar7._8_4_ * -*(float *)(ray + 8);
          fStack_5854 = auVar7._12_4_ * -*(float *)(ray + 0xc);
          fStack_5850 = -*(float *)(ray + 0x10) * 0.0;
          fStack_584c = -*(float *)(ray + 0x14) * 0.0;
          fStack_5848 = -*(float *)(ray + 0x18) * 0.0;
          local_5880 = auVar6._0_4_ * -auVar20._0_4_;
          fStack_587c = auVar6._4_4_ * -auVar20._4_4_;
          fStack_5878 = auVar6._8_4_ * -auVar20._8_4_;
          fStack_5874 = auVar6._12_4_ * -auVar20._12_4_;
          fStack_5870 = -auVar20._16_4_ * 0.0;
          fStack_586c = -auVar20._20_4_ * 0.0;
          fStack_5868 = -auVar20._24_4_ * 0.0;
          auVar20 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x100),ZEXT432(0) << 0x20);
          auVar24._8_4_ = 0xff800000;
          auVar24._0_8_ = 0xff800000ff800000;
          auVar24._12_4_ = 0xff800000;
          auVar24._16_4_ = 0xff800000;
          auVar24._20_4_ = 0xff800000;
          auVar24._24_4_ = 0xff800000;
          auVar24._28_4_ = 0xff800000;
          auVar26 = ZEXT3264(auVar24);
          local_59a0 = vblendvps_avx(auVar24,auVar20,local_5960);
          local_58a0 = auVar11._0_4_ * -*(float *)(ray + 0x40);
          fStack_589c = auVar11._4_4_ * -*(float *)(ray + 0x44);
          fStack_5898 = auVar11._8_4_ * -*(float *)(ray + 0x48);
          fStack_5894 = auVar11._12_4_ * -*(float *)(ray + 0x4c);
          fStack_5890 = -*(float *)(ray + 0x50) * 0.0;
          fStack_588c = -*(float *)(ray + 0x54) * 0.0;
          uStack_5884 = local_59a0._28_4_;
          fStack_5888 = -*(float *)(ray + 0x58) * 0.0;
          pauVar16 = (undefined1 (*) [32])local_4640;
          local_5900 = ZEXT1632(auVar7);
          local_5920 = ZEXT1632(auVar6);
          local_5940 = ZEXT1632(auVar11);
          local_59b0 = ray;
          uStack_5844 = uStack_5864;
LAB_00613558:
          auVar21 = auVar36._0_32_;
          pauVar1 = pauVar16 + -1;
          auVar22 = ZEXT3264(*pauVar1);
          pauVar16 = pauVar16 + -1;
          auVar20 = vcmpps_avx(*pauVar1,local_59a0,1);
          if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar20 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar20 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar20 >> 0x7f,0) != '\0') ||
                (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar20 >> 0xbf,0) != '\0') ||
              (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar20[0x1f] < '\0') {
            do {
              if ((uVar18 & 8) != 0) {
                if (uVar18 == 0xfffffffffffffff8) goto LAB_006137dd;
                auVar20 = vcmpps_avx(local_59a0,auVar22._0_32_,6);
                if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar20 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar20 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar20 >> 0x7f,0) != '\0') ||
                      (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar20 >> 0xbf,0) != '\0') ||
                    (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar20[0x1f] < '\0') {
                  auVar20 = vpcmpeqd_avx2(auVar26._0_32_,auVar26._0_32_);
                  local_59a8 = (ulong)((uint)uVar18 & 0xf) - 8;
                  local_58c0 = auVar21;
                  if (local_59a8 == 0) goto LAB_006137b2;
                  prim = (Primitive *)(uVar18 & 0xfffffffffffffff0);
                  local_59c0 = 1;
                  aVar4 = (anon_union_32_3_898e2e57_for_vboolf_impl<8>_1)(auVar21 ^ auVar20);
                  goto LAB_00613716;
                }
                break;
              }
              lVar14 = 0;
              uVar15 = 8;
              auVar20 = auVar37._0_32_;
              do {
                uVar3 = *(ulong *)((uVar18 & 0xfffffffffffffff0) + lVar14 * 8);
                if (uVar3 == 8) {
                  auVar22 = ZEXT3264(auVar20);
                  break;
                }
                uVar2 = *(undefined4 *)(uVar18 + 0x40 + lVar14 * 4);
                auVar25._4_4_ = uVar2;
                auVar25._0_4_ = uVar2;
                auVar25._8_4_ = uVar2;
                auVar25._12_4_ = uVar2;
                auVar25._16_4_ = uVar2;
                auVar25._20_4_ = uVar2;
                auVar25._24_4_ = uVar2;
                auVar25._28_4_ = uVar2;
                uVar2 = *(undefined4 *)(uVar18 + 0x80 + lVar14 * 4);
                auVar27._4_4_ = uVar2;
                auVar27._0_4_ = uVar2;
                auVar27._8_4_ = uVar2;
                auVar27._12_4_ = uVar2;
                auVar27._16_4_ = uVar2;
                auVar27._20_4_ = uVar2;
                auVar27._24_4_ = uVar2;
                auVar27._28_4_ = uVar2;
                auVar13._4_4_ = fStack_585c;
                auVar13._0_4_ = local_5860;
                auVar13._8_4_ = fStack_5858;
                auVar13._12_4_ = fStack_5854;
                auVar13._16_4_ = fStack_5850;
                auVar13._20_4_ = fStack_584c;
                auVar13._24_4_ = fStack_5848;
                auVar13._28_4_ = uStack_5844;
                auVar6 = vfmadd213ps_fma(auVar25,auVar35._0_32_,auVar13);
                auVar12._4_4_ = fStack_587c;
                auVar12._0_4_ = local_5880;
                auVar12._8_4_ = fStack_5878;
                auVar12._12_4_ = fStack_5874;
                auVar12._16_4_ = fStack_5870;
                auVar12._20_4_ = fStack_586c;
                auVar12._24_4_ = fStack_5868;
                auVar12._28_4_ = uStack_5864;
                auVar7 = vfmadd213ps_fma(auVar27,auVar39._0_32_,auVar12);
                uVar2 = *(undefined4 *)(uVar18 + 0xc0 + lVar14 * 4);
                auVar28._4_4_ = uVar2;
                auVar28._0_4_ = uVar2;
                auVar28._8_4_ = uVar2;
                auVar28._12_4_ = uVar2;
                auVar28._16_4_ = uVar2;
                auVar28._20_4_ = uVar2;
                auVar28._24_4_ = uVar2;
                auVar28._28_4_ = uVar2;
                auVar5._4_4_ = fStack_589c;
                auVar5._0_4_ = local_58a0;
                auVar5._8_4_ = fStack_5898;
                auVar5._12_4_ = fStack_5894;
                auVar5._16_4_ = fStack_5890;
                auVar5._20_4_ = fStack_588c;
                auVar5._24_4_ = fStack_5888;
                auVar5._28_4_ = uStack_5884;
                auVar11 = vfmadd213ps_fma(auVar28,auVar40._0_32_,auVar5);
                uVar2 = *(undefined4 *)(uVar18 + 0x60 + lVar14 * 4);
                auVar30._4_4_ = uVar2;
                auVar30._0_4_ = uVar2;
                auVar30._8_4_ = uVar2;
                auVar30._12_4_ = uVar2;
                auVar30._16_4_ = uVar2;
                auVar30._20_4_ = uVar2;
                auVar30._24_4_ = uVar2;
                auVar30._28_4_ = uVar2;
                auVar8 = vfmadd213ps_fma(auVar30,auVar35._0_32_,auVar13);
                uVar2 = *(undefined4 *)(uVar18 + 0xa0 + lVar14 * 4);
                auVar31._4_4_ = uVar2;
                auVar31._0_4_ = uVar2;
                auVar31._8_4_ = uVar2;
                auVar31._12_4_ = uVar2;
                auVar31._16_4_ = uVar2;
                auVar31._20_4_ = uVar2;
                auVar31._24_4_ = uVar2;
                auVar31._28_4_ = uVar2;
                uVar2 = *(undefined4 *)(uVar18 + 0xe0 + lVar14 * 4);
                auVar33._4_4_ = uVar2;
                auVar33._0_4_ = uVar2;
                auVar33._8_4_ = uVar2;
                auVar33._12_4_ = uVar2;
                auVar33._16_4_ = uVar2;
                auVar33._20_4_ = uVar2;
                auVar33._24_4_ = uVar2;
                auVar33._28_4_ = uVar2;
                auVar9 = vfmadd213ps_fma(auVar31,auVar39._0_32_,auVar12);
                auVar10 = vfmadd213ps_fma(auVar33,auVar40._0_32_,auVar5);
                auVar24 = vpminsd_avx2(ZEXT1632(auVar6),ZEXT1632(auVar8));
                auVar5 = vpminsd_avx2(ZEXT1632(auVar7),ZEXT1632(auVar9));
                auVar24 = vpmaxsd_avx2(auVar24,auVar5);
                auVar5 = vpminsd_avx2(ZEXT1632(auVar11),ZEXT1632(auVar10));
                auVar5 = vpmaxsd_avx2(auVar24,auVar5);
                auVar24 = vpmaxsd_avx2(ZEXT1632(auVar6),ZEXT1632(auVar8));
                auVar32 = vpmaxsd_avx2(ZEXT1632(auVar7),ZEXT1632(auVar9));
                auVar29 = vpminsd_avx2(auVar24,auVar32);
                auVar24 = vpmaxsd_avx2(ZEXT1632(auVar11),ZEXT1632(auVar10));
                auVar32 = vpmaxsd_avx2(auVar5,auVar38._0_32_);
                auVar24 = vpminsd_avx2(auVar24,local_59a0);
                auVar24 = vpminsd_avx2(auVar29,auVar24);
                auVar24 = vcmpps_avx(auVar32,auVar24,2);
                auVar26 = ZEXT3264(auVar24);
                if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar24 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar24 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar24 >> 0x7f,0) == '\0') &&
                      (auVar24 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar24 >> 0xbf,0) == '\0') &&
                    (auVar24 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar24[0x1f]) {
                  auVar22 = ZEXT3264(auVar20);
                  uVar3 = uVar15;
                }
                else {
                  auVar24 = vblendvps_avx(auVar37._0_32_,auVar5,auVar24);
                  auVar22 = ZEXT3264(auVar24);
                  if (uVar15 != 8) {
                    *puVar17 = uVar15;
                    puVar17 = puVar17 + 1;
                    *pauVar16 = auVar20;
                    pauVar16 = pauVar16 + 1;
                  }
                }
                uVar15 = uVar3;
                lVar14 = lVar14 + 1;
                auVar20 = auVar22._0_32_;
              } while (lVar14 != 8);
              uVar18 = uVar15;
            } while (uVar15 != 8);
          }
          goto LAB_006136a7;
        }
LAB_006137dd:
        auVar20 = vpand_avx2(auVar21,local_5960);
        auVar23._8_4_ = 0xff800000;
        auVar23._0_8_ = 0xff800000ff800000;
        auVar23._12_4_ = 0xff800000;
        auVar23._16_4_ = 0xff800000;
        auVar23._20_4_ = 0xff800000;
        auVar23._24_4_ = 0xff800000;
        auVar23._28_4_ = 0xff800000;
        auVar20 = vmaskmovps_avx(auVar20,auVar23);
        *(undefined1 (*) [32])local_59b8 = auVar20;
      }
    }
    else {
      occludedCoherent(valid_i,This,ray,context);
    }
  }
  return;
  while( true ) {
    prim = prim + 1;
    bVar19 = local_59a8 <= local_59c0;
    local_59c0 = local_59c0 + 1;
    if (bVar19) break;
LAB_00613716:
    local_5980 = aVar4;
    InstanceIntersectorK<8>::occluded
              ((vbool<8> *)&local_5840.field_1,(vbool<8> *)&local_5980.field_1,&local_59c1,ray,
               context,prim);
    aVar4.v = (__m256)vandnps_avx(local_5840.v,local_5980.v);
    auVar20 = (undefined1  [32])local_5980 & ~(undefined1  [32])local_5840;
    ray = local_59b0;
    if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar20 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar20 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar20 >> 0x7f,0) == '\0') &&
          (auVar20 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar20 >> 0xbf,0) == '\0') &&
        (auVar20 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar20[0x1f])
    break;
  }
  auVar20 = vpcmpeqd_avx2((undefined1  [32])local_5980,(undefined1  [32])local_5980);
  auVar21._0_4_ = aVar4.i[0] ^ auVar20._0_4_;
  auVar21._4_4_ = aVar4.i[1] ^ auVar20._4_4_;
  auVar21._8_4_ = aVar4.i[2] ^ auVar20._8_4_;
  auVar21._12_4_ = aVar4.i[3] ^ auVar20._12_4_;
  auVar21._16_4_ = aVar4.i[4] ^ auVar20._16_4_;
  auVar21._20_4_ = aVar4.i[5] ^ auVar20._20_4_;
  auVar21._24_4_ = aVar4.i[6] ^ auVar20._24_4_;
  auVar21._28_4_ = aVar4.i[7] ^ auVar20._28_4_;
  auVar37 = ZEXT3264(CONCAT428(0x7f800000,
                               CONCAT424(0x7f800000,
                                         CONCAT420(0x7f800000,
                                                   CONCAT416(0x7f800000,
                                                             CONCAT412(0x7f800000,
                                                                       CONCAT48(0x7f800000,
                                                                                0x7f8000007f800000))
                                                            )))));
  auVar38 = ZEXT3264(local_58e0);
  auVar35 = ZEXT3264(local_5900);
  auVar39 = ZEXT3264(local_5920);
  auVar40 = ZEXT3264(local_5940);
LAB_006137b2:
  auVar26 = ZEXT3264(auVar20);
  auVar21 = vpor_avx2(local_58c0,auVar21);
  auVar36 = ZEXT3264(auVar21);
  auVar20 = auVar20 & ~auVar21;
  if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
           (auVar20 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (auVar20 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
         SUB321(auVar20 >> 0x7f,0) == '\0') &&
        (auVar20 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
       SUB321(auVar20 >> 0xbf,0) == '\0') &&
      (auVar20 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar20[0x1f])
  goto LAB_006137dd;
  auVar20._8_4_ = 0xff800000;
  auVar20._0_8_ = 0xff800000ff800000;
  auVar20._12_4_ = 0xff800000;
  auVar20._16_4_ = 0xff800000;
  auVar20._20_4_ = 0xff800000;
  auVar20._24_4_ = 0xff800000;
  auVar20._28_4_ = 0xff800000;
  local_59a0 = vblendvps_avx(local_59a0,auVar20,auVar21);
LAB_006136a7:
  auVar21 = auVar36._0_32_;
  uVar18 = puVar17[-1];
  puVar17 = puVar17 + -1;
  if (uVar18 == 0xfffffffffffffff8) goto LAB_006137dd;
  goto LAB_00613558;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }